

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O3

MaybeResult<wasm::Ok> *
wasm::WATParser::global<wasm::WATParser::ParseModuleTypesCtx>
          (MaybeResult<wasm::Ok> *__return_storage_ptr__,ParseModuleTypesCtx *ctx)

{
  Lexer *this;
  undefined1 *puVar1;
  Type *pTVar2;
  undefined8 *puVar3;
  __index_type *__rhs;
  undefined8 uVar4;
  __uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_> _Var5;
  bool bVar6;
  __index_type *p_Var7;
  string_view expected;
  undefined1 local_130 [8];
  Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> exports;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  string local_e8;
  undefined1 local_c8 [8];
  MaybeResult<wasm::WATParser::ImportNames> import;
  Result<wasm::Ok> _val_3;
  Result<wasm::WATParser::GlobalType> type;
  Result<wasm::WATParser::GlobalType> _val_2;
  
  this = &ctx->in;
  expected._M_str = "global";
  expected._M_len = 6;
  bVar6 = Lexer::takeSExprStart(this,expected);
  if (!bVar6) {
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x01';
    return __return_storage_ptr__;
  }
  Lexer::takeID((optional<wasm::Name> *)local_130,this);
  inlineExports((Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> *)local_130,this);
  std::__detail::__variant::
  _Copy_ctor_base<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>::
  _Copy_ctor_base((_Copy_ctor_base<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                   *)local_c8,
                  (_Copy_ctor_base<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                   *)local_130);
  if (import.val.super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>._M_u._24_1_
      == '\x01') {
    puVar1 = (undefined1 *)
             ((long)&type.val.super__Variant_base<wasm::WATParser::GlobalType,_wasm::Err>.
                     super__Move_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                     super__Copy_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                     super__Move_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err> + 8);
    _val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
    super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
    super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_ = puVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)
               ((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),local_c8,
               import.val.super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
               super__Variant_storage_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
               _M_u._M_first._M_storage.mod.super_IString.str._M_len + (long)local_c8);
    pTVar2 = (Type *)((long)&(__return_storage_ptr__->val).
                             super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10);
    *(Type **)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = pTVar2;
    if ((undefined1 *)
        _val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_ == puVar1) {
      pTVar2->id = (uintptr_t)
                   type.val.super__Variant_base<wasm::WATParser::GlobalType,_wasm::Err>.
                   super__Move_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                   super__Copy_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                   super__Move_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                   super__Variant_storage_alias<wasm::WATParser::GlobalType,_wasm::Err>._M_u.
                   _M_first._M_storage.type.id;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x18) =
           type.val.super__Variant_base<wasm::WATParser::GlobalType,_wasm::Err>.
           super__Move_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
           super__Copy_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
           super__Move_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
           super__Copy_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
           super__Variant_storage_alias<wasm::WATParser::GlobalType,_wasm::Err>._M_u._16_8_;
    }
    else {
      *(undefined8 *)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> =
           _val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>
           .super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
           super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_;
      ((Type *)((long)&(__return_storage_ptr__->val).
                       super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10))->id =
           (uintptr_t)
           type.val.super__Variant_base<wasm::WATParser::GlobalType,_wasm::Err>.
           super__Move_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
           super__Copy_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
           super__Move_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
           super__Copy_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
           super__Variant_storage_alias<wasm::WATParser::GlobalType,_wasm::Err>._M_u._M_first.
           _M_storage.type.id;
    }
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8) =
         type.val.super__Variant_base<wasm::WATParser::GlobalType,_wasm::Err>.
         super__Move_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
         super__Copy_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
         super__Move_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
         super__Copy_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
         super__Variant_storage_alias<wasm::WATParser::GlobalType,_wasm::Err>._M_u._0_8_;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x02';
    std::__detail::__variant::
    _Variant_storage<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                       *)local_c8);
    goto LAB_00bc5713;
  }
  std::__detail::__variant::
  _Variant_storage<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>::
  ~_Variant_storage((_Variant_storage<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                     *)local_c8);
  inlineImport((MaybeResult<wasm::WATParser::ImportNames> *)local_c8,this);
  std::__detail::__variant::
  _Copy_ctor_base<false,_wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>::_Copy_ctor_base
            ((_Copy_ctor_base<false,_wasm::WATParser::ImportNames,_wasm::None,_wasm::Err> *)
             ((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),
             (_Copy_ctor_base<false,_wasm::WATParser::ImportNames,_wasm::None,_wasm::Err> *)local_c8
            );
  if (type.val.super__Variant_base<wasm::WATParser::GlobalType,_wasm::Err>.
      super__Move_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
      super__Copy_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
      super__Move_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
      super__Copy_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
      super__Variant_storage_alias<wasm::WATParser::GlobalType,_wasm::Err>._M_u._24_1_ == '\x02') {
    puVar1 = (undefined1 *)
             ((long)&_val_2.val.super__Variant_base<wasm::WATParser::GlobalType,_wasm::Err>.
                     super__Move_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                     super__Copy_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                     super__Move_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err> + 8);
    type.val.super__Variant_base<wasm::WATParser::GlobalType,_wasm::Err>.
    super__Move_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
    super__Copy_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
    super__Move_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
    super__Copy_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
    super__Variant_storage_alias<wasm::WATParser::GlobalType,_wasm::Err>._32_8_ = puVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)
               ((long)&type.val.super__Variant_base<wasm::WATParser::GlobalType,_wasm::Err>.
                       super__Move_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                       super__Copy_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                       super__Move_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err> + 0x20),
               _val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_,
               type.val.super__Variant_base<wasm::WATParser::GlobalType,_wasm::Err>.
               super__Move_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
               super__Copy_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
               super__Move_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
               super__Copy_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
               super__Variant_storage_alias<wasm::WATParser::GlobalType,_wasm::Err>._M_u._0_8_ +
               _val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_);
    puVar3 = (undefined8 *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar3;
    if ((undefined1 *)
        type.val.super__Variant_base<wasm::WATParser::GlobalType,_wasm::Err>.
        super__Move_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
        super__Copy_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
        super__Move_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
        super__Copy_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
        super__Variant_storage_alias<wasm::WATParser::GlobalType,_wasm::Err>._32_8_ == puVar1) {
      *puVar3 = CONCAT71(_val_2.val.super__Variant_base<wasm::WATParser::GlobalType,_wasm::Err>.
                         super__Move_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                         super__Copy_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                         super__Move_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                         super__Variant_storage_alias<wasm::WATParser::GlobalType,_wasm::Err>._M_u.
                         _M_first._M_storage.type.id._1_7_,
                         _val_2.val.super__Variant_base<wasm::WATParser::GlobalType,_wasm::Err>.
                         super__Move_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                         super__Copy_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                         super__Move_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                         super__Variant_storage_alias<wasm::WATParser::GlobalType,_wasm::Err>._M_u.
                         _M_first._M_storage.type.id._0_1_);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x18) =
           _val_2.val.super__Variant_base<wasm::WATParser::GlobalType,_wasm::Err>.
           super__Move_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
           super__Copy_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
           super__Move_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
           super__Copy_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
           super__Variant_storage_alias<wasm::WATParser::GlobalType,_wasm::Err>._M_u._16_8_;
    }
    else {
      *(undefined8 *)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> =
           type.val.super__Variant_base<wasm::WATParser::GlobalType,_wasm::Err>.
           super__Move_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
           super__Copy_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
           super__Move_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
           super__Copy_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
           super__Variant_storage_alias<wasm::WATParser::GlobalType,_wasm::Err>._32_8_;
      *(ulong *)((long)&(__return_storage_ptr__->val).
                        super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10) =
           CONCAT71(_val_2.val.super__Variant_base<wasm::WATParser::GlobalType,_wasm::Err>.
                    super__Move_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                    super__Copy_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                    super__Move_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                    super__Variant_storage_alias<wasm::WATParser::GlobalType,_wasm::Err>._M_u.
                    _M_first._M_storage.type.id._1_7_,
                    _val_2.val.super__Variant_base<wasm::WATParser::GlobalType,_wasm::Err>.
                    super__Move_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                    super__Copy_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                    super__Move_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                    super__Variant_storage_alias<wasm::WATParser::GlobalType,_wasm::Err>._M_u.
                    _M_first._M_storage.type.id._0_1_);
    }
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8) =
         _val_2.val.super__Variant_base<wasm::WATParser::GlobalType,_wasm::Err>.
         super__Move_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
         super__Copy_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
         super__Move_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
         super__Copy_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
         super__Variant_storage_alias<wasm::WATParser::GlobalType,_wasm::Err>._M_u._0_8_;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x02';
    std::__detail::__variant::
    _Variant_storage<false,_wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::WATParser::ImportNames,_wasm::None,_wasm::Err> *)
               ((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
  }
  else {
    std::__detail::__variant::
    _Variant_storage<false,_wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::WATParser::ImportNames,_wasm::None,_wasm::Err> *)
               ((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
    globaltype<wasm::WATParser::ParseModuleTypesCtx>
              ((Result<wasm::WATParser::GlobalType> *)
               ((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),ctx);
    __rhs = (__index_type *)
            ((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                    super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20);
    std::__detail::__variant::_Copy_ctor_base<false,_wasm::WATParser::GlobalType,_wasm::Err>::
    _Copy_ctor_base((_Copy_ctor_base<false,_wasm::WATParser::GlobalType,_wasm::Err> *)
                    ((long)&type.val.super__Variant_base<wasm::WATParser::GlobalType,_wasm::Err>.
                            super__Move_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                            super__Copy_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                            super__Move_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err> + 0x20),
                    (_Copy_ctor_base<false,_wasm::WATParser::GlobalType,_wasm::Err> *)__rhs);
    if (_val_2.val.super__Variant_base<wasm::WATParser::GlobalType,_wasm::Err>.
        super__Move_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
        super__Copy_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
        super__Move_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
        super__Copy_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
        super__Variant_storage_alias<wasm::WATParser::GlobalType,_wasm::Err>._M_u._24_1_ == '\x01')
    {
      puVar1 = (undefined1 *)
               ((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 8);
      import.val.super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>._32_8_ =
           puVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)
                 ((long)&import.val.
                         super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                         .
                         super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                         .
                         super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                         .
                         super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                 + 0x20),type.val.super__Variant_base<wasm::WATParser::GlobalType,_wasm::Err>.
                         super__Move_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                         super__Copy_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                         super__Move_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                         super__Variant_storage_alias<wasm::WATParser::GlobalType,_wasm::Err>._32_8_
                 ,_val_2.val.super__Variant_base<wasm::WATParser::GlobalType,_wasm::Err>.
                  super__Move_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                  super__Copy_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                  super__Move_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                  super__Variant_storage_alias<wasm::WATParser::GlobalType,_wasm::Err>._M_u._0_8_ +
                  type.val.super__Variant_base<wasm::WATParser::GlobalType,_wasm::Err>.
                  super__Move_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                  super__Copy_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                  super__Move_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                  super__Variant_storage_alias<wasm::WATParser::GlobalType,_wasm::Err>._32_8_);
      puVar3 = (undefined8 *)
               ((long)&(__return_storage_ptr__->val).
                       super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10);
      *(undefined8 **)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar3;
      if ((undefined1 *)
          import.val.super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>._32_8_
          == puVar1) {
        *puVar3 = _val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                  super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_8_;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x18) =
             _val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>
             .super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._16_8_;
      }
      else {
        *(undefined8 *)
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> =
             import.val.super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
             _32_8_;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10) =
             _val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>
             .super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_8_;
      }
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8) =
           _val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>
           .super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
           super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x02';
      std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::GlobalType,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::GlobalType,_wasm::Err> *)
                        ((long)&type.val.super__Variant_base<wasm::WATParser::GlobalType,_wasm::Err>
                                .super__Move_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                                super__Copy_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                                super__Move_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err> +
                        0x20));
    }
    else {
      std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::GlobalType,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::GlobalType,_wasm::Err> *)
                        ((long)&type.val.super__Variant_base<wasm::WATParser::GlobalType,_wasm::Err>
                                .super__Move_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                                super__Copy_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                                super__Move_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err> +
                        0x20));
      if (import.val.super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>._M_u.
          _24_1_ == '\x01') {
        expr<wasm::WATParser::ParseModuleTypesCtx>
                  ((Result<wasm::Ok> *)
                   ((long)&type.val.super__Variant_base<wasm::WATParser::GlobalType,_wasm::Err>.
                           super__Move_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                           super__Copy_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                           super__Move_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err> + 0x20),
                   ctx);
        std::__detail::__variant::_Copy_ctor_base<false,_wasm::Ok,_wasm::Err>::_Copy_ctor_base
                  ((_Copy_ctor_base<false,_wasm::Ok,_wasm::Err> *)
                   ((long)&import.val.
                           super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                           super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                           .
                           super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                           .
                           super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                           .
                           super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                   + 0x20),(_Copy_ctor_base<false,_wasm::Ok,_wasm::Err> *)
                           ((long)&type.val.
                                   super__Variant_base<wasm::WATParser::GlobalType,_wasm::Err>.
                                   super__Move_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                                   super__Copy_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                                   super__Move_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                                   super__Copy_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err> +
                           0x20));
        if (_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
          exports.val.
          super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>.
          super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
          super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
          super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
          super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
          super__Variant_storage_alias<std::vector<wasm::Name>,_wasm::Err>._32_8_ = &local_f8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)
                     ((long)&exports.val.
                             super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                             .super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                             super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                             super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
                             super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err> + 0x20),
                     import.val.
                     super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                     super__Variant_storage_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                     ._32_8_,_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                             super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_ +
                             import.val.
                             super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                             .
                             super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                             .
                             super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                             .
                             super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                             .
                             super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                             .
                             super__Variant_storage_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                             ._32_8_);
          puVar3 = (undefined8 *)
                   ((long)&(__return_storage_ptr__->val).
                           super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10);
          *(undefined8 **)
           &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar3;
          if ((undefined8 *)
              exports.val.
              super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>.
              super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
              super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
              super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
              super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
              super__Variant_storage_alias<std::vector<wasm::Name>,_wasm::Err>._32_8_ == &local_f8)
          {
            *puVar3 = local_f8;
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x18) =
                 uStack_f0;
          }
          else {
            *(undefined8 *)
             &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> =
                 exports.val.
                 super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                 .super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                 super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                 super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
                 super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
                 super__Variant_storage_alias<std::vector<wasm::Name>,_wasm::Err>._32_8_;
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10) =
                 local_f8;
          }
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8) = local_100;
          *(__index_type *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x02';
          std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                    ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
                     ((long)&import.val.
                             super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                             .
                             super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                             .
                             super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                             .
                             super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                             .
                             super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                     + 0x20));
          std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                    ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
                     ((long)&type.val.super__Variant_base<wasm::WATParser::GlobalType,_wasm::Err>.
                             super__Move_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                             super__Copy_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                             super__Move_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err> + 0x20))
          ;
          goto LAB_00bc56fe;
        }
        std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
                   ((long)&import.val.
                           super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                           super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                           .
                           super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                           .
                           super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                           .
                           super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                   + 0x20));
        std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
                   ((long)&type.val.super__Variant_base<wasm::WATParser::GlobalType,_wasm::Err>.
                           super__Move_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                           super__Copy_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                           super__Move_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err> + 0x20));
      }
      bVar6 = Lexer::takeRParen(this);
      if (bVar6) {
        p_Var7 = (__index_type *)0x0;
        if (type.val.super__Variant_base<wasm::WATParser::GlobalType,_wasm::Err>.
            super__Move_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
            super__Copy_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
            super__Move_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
            super__Copy_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
            super__Variant_storage_alias<wasm::WATParser::GlobalType,_wasm::Err>._M_u._24_1_ == '\0'
           ) {
          p_Var7 = __rhs;
        }
        uVar4 = *(undefined8 *)(p_Var7 + 8);
        _Var5._M_t.super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
        super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl =
             (ctx->wasm->globals).
             super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[ctx->index]._M_t.
             super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t;
        *(bool *)((long)_Var5._M_t.
                        super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                        super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl + 0x48) =
             _val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>
             .super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_4_ != 0;
        *(undefined8 *)
         ((long)_Var5._M_t.
                super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl + 0x38) = uVar4;
        _val_2.val.super__Variant_base<wasm::WATParser::GlobalType,_wasm::Err>.
        super__Move_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
        super__Copy_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
        super__Move_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
        super__Copy_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
        super__Variant_storage_alias<wasm::WATParser::GlobalType,_wasm::Err>._M_u._24_1_ = 0;
        std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
                   ((long)&type.val.super__Variant_base<wasm::WATParser::GlobalType,_wasm::Err>.
                           super__Move_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                           super__Copy_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                           super__Move_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err> + 0x20));
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\0';
      }
      else {
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_e8,"expected end of global","");
        Lexer::err((Err *)((long)&type.val.
                                  super__Variant_base<wasm::WATParser::GlobalType,_wasm::Err>.
                                  super__Move_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                                  super__Copy_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                                  super__Move_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                                  super__Copy_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err> +
                          0x20),this,&local_e8);
        puVar3 = (undefined8 *)
                 ((long)&(__return_storage_ptr__->val).
                         super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10);
        *(undefined8 **)
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar3;
        puVar1 = (undefined1 *)
                 ((long)&_val_2.val.super__Variant_base<wasm::WATParser::GlobalType,_wasm::Err>.
                         super__Move_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                         super__Copy_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                         super__Move_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err> + 8);
        if ((undefined1 *)
            type.val.super__Variant_base<wasm::WATParser::GlobalType,_wasm::Err>.
            super__Move_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
            super__Copy_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
            super__Move_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
            super__Copy_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
            super__Variant_storage_alias<wasm::WATParser::GlobalType,_wasm::Err>._32_8_ == puVar1) {
          *puVar3 = CONCAT71(_val_2.val.super__Variant_base<wasm::WATParser::GlobalType,_wasm::Err>.
                             super__Move_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                             super__Copy_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                             super__Move_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                             super__Variant_storage_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                             _M_u._M_first._M_storage.type.id._1_7_,
                             _val_2.val.super__Variant_base<wasm::WATParser::GlobalType,_wasm::Err>.
                             super__Move_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                             super__Copy_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                             super__Move_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                             super__Variant_storage_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                             _M_u._M_first._M_storage.type.id._0_1_);
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x18) =
               _val_2.val.super__Variant_base<wasm::WATParser::GlobalType,_wasm::Err>.
               super__Move_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
               super__Copy_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
               super__Move_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
               super__Copy_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
               super__Variant_storage_alias<wasm::WATParser::GlobalType,_wasm::Err>._M_u._16_8_;
        }
        else {
          *(undefined8 *)
           &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> =
               type.val.super__Variant_base<wasm::WATParser::GlobalType,_wasm::Err>.
               super__Move_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
               super__Copy_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
               super__Move_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
               super__Copy_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
               super__Variant_storage_alias<wasm::WATParser::GlobalType,_wasm::Err>._32_8_;
          *(ulong *)((long)&(__return_storage_ptr__->val).
                            super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                            super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                            super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                            super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                            super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10) =
               CONCAT71(_val_2.val.super__Variant_base<wasm::WATParser::GlobalType,_wasm::Err>.
                        super__Move_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                        super__Copy_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                        super__Move_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                        super__Variant_storage_alias<wasm::WATParser::GlobalType,_wasm::Err>._M_u.
                        _M_first._M_storage.type.id._1_7_,
                        _val_2.val.super__Variant_base<wasm::WATParser::GlobalType,_wasm::Err>.
                        super__Move_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                        super__Copy_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                        super__Move_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
                        super__Variant_storage_alias<wasm::WATParser::GlobalType,_wasm::Err>._M_u.
                        _M_first._M_storage.type.id._0_1_);
        }
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8) =
             _val_2.val.super__Variant_base<wasm::WATParser::GlobalType,_wasm::Err>.
             super__Move_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
             super__Copy_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
             super__Move_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
             super__Copy_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
             super__Variant_storage_alias<wasm::WATParser::GlobalType,_wasm::Err>._M_u._0_8_;
        _val_2.val.super__Variant_base<wasm::WATParser::GlobalType,_wasm::Err>.
        super__Move_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
        super__Copy_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
        super__Move_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
        super__Copy_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
        super__Variant_storage_alias<wasm::WATParser::GlobalType,_wasm::Err>._M_u._0_8_ = 0;
        _val_2.val.super__Variant_base<wasm::WATParser::GlobalType,_wasm::Err>.
        super__Move_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
        super__Copy_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
        super__Move_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
        super__Copy_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
        super__Variant_storage_alias<wasm::WATParser::GlobalType,_wasm::Err>._M_u._M_first.
        _M_storage.type.id._0_1_ = 0;
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x02';
        type.val.super__Variant_base<wasm::WATParser::GlobalType,_wasm::Err>.
        super__Move_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
        super__Copy_assign_alias<wasm::WATParser::GlobalType,_wasm::Err>.
        super__Move_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
        super__Copy_ctor_alias<wasm::WATParser::GlobalType,_wasm::Err>.
        super__Variant_storage_alias<wasm::WATParser::GlobalType,_wasm::Err>._32_8_ = puVar1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
        }
      }
    }
LAB_00bc56fe:
    std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::GlobalType,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::GlobalType,_wasm::Err> *)
                      ((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
  }
  std::__detail::__variant::
  _Variant_storage<false,_wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>::~_Variant_storage
            ((_Variant_storage<false,_wasm::WATParser::ImportNames,_wasm::None,_wasm::Err> *)
             local_c8);
LAB_00bc5713:
  std::__detail::__variant::
  _Variant_storage<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>::
  ~_Variant_storage((_Variant_storage<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                     *)local_130);
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<> global(Ctx& ctx) {
  auto pos = ctx.in.getPos();
  if (!ctx.in.takeSExprStart("global"sv)) {
    return {};
  }

  Name name;
  if (auto id = ctx.in.takeID()) {
    name = *id;
  }

  auto exports = inlineExports(ctx.in);
  CHECK_ERR(exports);

  auto import = inlineImport(ctx.in);
  CHECK_ERR(import);

  auto type = globaltype(ctx);
  CHECK_ERR(type);

  std::optional<typename Ctx::ExprT> exp;
  if (!import) {
    auto e = expr(ctx);
    CHECK_ERR(e);
    exp = *e;
  }

  if (!ctx.in.takeRParen()) {
    return ctx.in.err("expected end of global");
  }

  CHECK_ERR(ctx.addGlobal(name, *exports, import.getPtr(), *type, exp, pos));
  return Ok{};
}